

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dont_underflow_cpp.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  size_type sVar1;
  allocator<char> local_29;
  string str;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&str,argv[1],&local_29);
  sVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::rfind
                    (&str,':',0xffffffffffffffff);
  if (sVar1 != 0xffffffffffffffff) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
              (&str,sVar1 + 1,0xffffffffffffffff);
  }
  std::__cxx11::string::~string((string *)&str);
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
  std::string str = argv[1];
  size_t pos = str.find_last_of(':');
  if (pos != std::string::npos)
    str.erase(pos + 1);
}